

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int iso9660_finish_entry(archive_write *a)

{
  mode_t mVar1;
  ssize_t sVar2;
  archive_write *in_RDI;
  void *unaff_retaddr;
  size_t s;
  iso9660_conflict *iso9660;
  uint64_t local_28;
  iso9660_conflict *iso9660_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  iso9660_00 = (iso9660_conflict *)in_RDI->format_data;
  if (iso9660_00->cur_file == (isofile *)0x0) {
    iVar3 = 0;
  }
  else {
    mVar1 = archive_entry_filetype(iso9660_00->cur_file->entry);
    if (mVar1 == 0x8000) {
      if ((iso9660_00->cur_file->content).size == 0) {
        iVar3 = 0;
      }
      else {
        while (iso9660_00->bytes_remaining != 0) {
          if (in_RDI->null_length < iso9660_00->bytes_remaining) {
            local_28 = in_RDI->null_length;
          }
          else {
            local_28 = iso9660_00->bytes_remaining;
          }
          sVar2 = write_iso9660_data((archive_write *)s,unaff_retaddr,
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
          if (sVar2 < 0) {
            return -0x1e;
          }
          iso9660_00->bytes_remaining = iso9660_00->bytes_remaining - local_28;
        }
        if (((char)(*(char *)&iso9660_00->zisofs << 6) < '\0') &&
           (iVar3 = zisofs_finish_entry((archive_write *)s), iVar3 != 0)) {
          iVar3 = -0x1e;
        }
        else {
          iVar3 = wb_write_padding_to_temp(in_RDI,(int64_t)iso9660_00);
          if (iVar3 == 0) {
            iso9660_00->cur_file->cur_content->blocks =
                 (int)(iso9660_00->cur_file->cur_content->size + 0x7ff >> 0xb);
            isofile_add_data_file(iso9660_00,iso9660_00->cur_file);
            iVar3 = 0;
          }
          else {
            iVar3 = -0x1e;
          }
        }
      }
    }
    else {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
iso9660_finish_entry(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;

	if (iso9660->cur_file == NULL)
		return (ARCHIVE_OK);
	if (archive_entry_filetype(iso9660->cur_file->entry) != AE_IFREG)
		return (ARCHIVE_OK);
	if (iso9660->cur_file->content.size == 0)
		return (ARCHIVE_OK);

	/* If there are unwritten data, write null data instead. */
	while (iso9660->bytes_remaining > 0) {
		size_t s;

		s = (iso9660->bytes_remaining > a->null_length)?
		    a->null_length: (size_t)iso9660->bytes_remaining;
		if (write_iso9660_data(a, a->nulls, s) < 0)
			return (ARCHIVE_FATAL);
		iso9660->bytes_remaining -= s;
	}

	if (iso9660->zisofs.making && zisofs_finish_entry(a) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Write padding. */
	if (wb_write_padding_to_temp(a, iso9660->cur_file->cur_content->size)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Compute the logical block number. */
	iso9660->cur_file->cur_content->blocks = (int)
	    ((iso9660->cur_file->cur_content->size
	     + LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);

	/* Add the current file to data file list. */
	isofile_add_data_file(iso9660, iso9660->cur_file);

	return (ARCHIVE_OK);
}